

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::SetRPath(string *file,string *newRPath,string *emsg,bool *changed)

{
  pointer pcVar1;
  long *plVar2;
  optional<bool> oVar3;
  string *psVar4;
  _Storage<bool,_true> _Var5;
  anon_class_32_1_393cdf75 adjustCallback;
  long *local_98;
  long local_90;
  long local_88 [2];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  bool *local_58;
  _Any_data local_50;
  code *local_40;
  
  local_98 = local_88;
  pcVar1 = (newRPath->_M_dataplus)._M_p;
  local_58 = changed;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + newRPath->_M_string_length);
  anon_unknown.dwarf_14f13::MakeEmptyCallback
            ((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
              *)&local_50,(anon_unknown_dwarf_14f13 *)(newRPath->_M_dataplus)._M_p,
             (string *)newRPath->_M_string_length);
  plVar2 = local_98;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar4,plVar2,local_90 + (long)plVar2);
  pcStack_60 = std::
               _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:3025:25)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:3025:25)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)psVar4;
  oVar3 = anon_unknown.dwarf_14f13::AdjustRPathELF
                    (file,(EmptyCallback *)&local_50,(AdjustCallback *)&local_78,emsg,local_58);
  _Var5._M_value =
       oVar3.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
       _M_payload;
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) {
    if (newRPath->_M_string_length == 0) {
      _Var5._M_value = true;
    }
    else if (emsg == (string *)0x0) {
      _Var5._M_value = false;
    }
    else {
      _Var5._M_value = false;
      std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x25da73);
    }
  }
  return (bool)(_Var5._M_value & 1);
}

Assistant:

bool cmSystemTools::SetRPath(std::string const& file,
                             std::string const& newRPath, std::string* emsg,
                             bool* changed)
{
  if (cm::optional<bool> result = SetRPathELF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result =
        SetRPathXCOFF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}